

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.hpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArraySamplingTest::shaderCollectionForSamplingRoutine::
shaderCollectionForSamplingRoutine
          (shaderCollectionForSamplingRoutine *this,shaderCollectionForSamplingRoutine *param_1)

{
  pointer pcVar1;
  
  (this->pass_through_vertex_shader).m_shader_stage =
       (param_1->pass_through_vertex_shader).m_shader_stage;
  (this->pass_through_vertex_shader).m_gl = (param_1->pass_through_vertex_shader).m_gl;
  (this->pass_through_vertex_shader).m_source._M_dataplus._M_p =
       (pointer)&(this->pass_through_vertex_shader).m_source.field_2;
  pcVar1 = (param_1->pass_through_vertex_shader).m_source._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->pass_through_vertex_shader).m_source,pcVar1,
             pcVar1 + (param_1->pass_through_vertex_shader).m_source._M_string_length);
  (this->pass_through_vertex_shader).m_shader_object_id =
       (param_1->pass_through_vertex_shader).m_shader_object_id;
  (this->pass_through_tesselation_control_shader).m_gl =
       (param_1->pass_through_tesselation_control_shader).m_gl;
  (this->pass_through_tesselation_control_shader).m_shader_stage =
       (param_1->pass_through_tesselation_control_shader).m_shader_stage;
  (this->pass_through_tesselation_control_shader).m_source._M_dataplus._M_p =
       (pointer)&(this->pass_through_tesselation_control_shader).m_source.field_2;
  pcVar1 = (param_1->pass_through_tesselation_control_shader).m_source._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->pass_through_tesselation_control_shader).m_source,pcVar1,
             pcVar1 + (param_1->pass_through_tesselation_control_shader).m_source._M_string_length);
  (this->pass_through_tesselation_control_shader).m_shader_object_id =
       (param_1->pass_through_tesselation_control_shader).m_shader_object_id;
  (this->sampling_compute_shader).m_gl = (param_1->sampling_compute_shader).m_gl;
  (this->sampling_compute_shader).m_shader_stage = (param_1->sampling_compute_shader).m_shader_stage
  ;
  (this->sampling_compute_shader).m_source._M_dataplus._M_p =
       (pointer)&(this->sampling_compute_shader).m_source.field_2;
  pcVar1 = (param_1->sampling_compute_shader).m_source._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->sampling_compute_shader).m_source,pcVar1,
             pcVar1 + (param_1->sampling_compute_shader).m_source._M_string_length);
  (this->sampling_compute_shader).m_shader_object_id =
       (param_1->sampling_compute_shader).m_shader_object_id;
  (this->sampling_fragment_shader).m_gl = (param_1->sampling_fragment_shader).m_gl;
  (this->sampling_fragment_shader).m_shader_stage =
       (param_1->sampling_fragment_shader).m_shader_stage;
  (this->sampling_fragment_shader).m_source._M_dataplus._M_p =
       (pointer)&(this->sampling_fragment_shader).m_source.field_2;
  pcVar1 = (param_1->sampling_fragment_shader).m_source._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->sampling_fragment_shader).m_source,pcVar1,
             pcVar1 + (param_1->sampling_fragment_shader).m_source._M_string_length);
  (this->sampling_fragment_shader).m_shader_object_id =
       (param_1->sampling_fragment_shader).m_shader_object_id;
  (this->sampling_geometry_shader).m_gl = (param_1->sampling_geometry_shader).m_gl;
  (this->sampling_geometry_shader).m_shader_stage =
       (param_1->sampling_geometry_shader).m_shader_stage;
  (this->sampling_geometry_shader).m_source._M_dataplus._M_p =
       (pointer)&(this->sampling_geometry_shader).m_source.field_2;
  pcVar1 = (param_1->sampling_geometry_shader).m_source._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->sampling_geometry_shader).m_source,pcVar1,
             pcVar1 + (param_1->sampling_geometry_shader).m_source._M_string_length);
  (this->sampling_geometry_shader).m_shader_object_id =
       (param_1->sampling_geometry_shader).m_shader_object_id;
  (this->sampling_tesselation_control_shader).m_gl =
       (param_1->sampling_tesselation_control_shader).m_gl;
  (this->sampling_tesselation_control_shader).m_shader_stage =
       (param_1->sampling_tesselation_control_shader).m_shader_stage;
  (this->sampling_tesselation_control_shader).m_source._M_dataplus._M_p =
       (pointer)&(this->sampling_tesselation_control_shader).m_source.field_2;
  pcVar1 = (param_1->sampling_tesselation_control_shader).m_source._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->sampling_tesselation_control_shader).m_source,pcVar1,
             pcVar1 + (param_1->sampling_tesselation_control_shader).m_source._M_string_length);
  (this->sampling_tesselation_control_shader).m_shader_object_id =
       (param_1->sampling_tesselation_control_shader).m_shader_object_id;
  (this->sampling_tesselation_evaluation_shader).m_gl =
       (param_1->sampling_tesselation_evaluation_shader).m_gl;
  (this->sampling_tesselation_evaluation_shader).m_shader_stage =
       (param_1->sampling_tesselation_evaluation_shader).m_shader_stage;
  (this->sampling_tesselation_evaluation_shader).m_source._M_dataplus._M_p =
       (pointer)&(this->sampling_tesselation_evaluation_shader).m_source.field_2;
  pcVar1 = (param_1->sampling_tesselation_evaluation_shader).m_source._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->sampling_tesselation_evaluation_shader).m_source,pcVar1,
             pcVar1 + (param_1->sampling_tesselation_evaluation_shader).m_source._M_string_length);
  (this->sampling_tesselation_evaluation_shader).m_shader_object_id =
       (param_1->sampling_tesselation_evaluation_shader).m_shader_object_id;
  (this->sampling_vertex_shader).m_gl = (param_1->sampling_vertex_shader).m_gl;
  (this->sampling_vertex_shader).m_shader_stage = (param_1->sampling_vertex_shader).m_shader_stage;
  (this->sampling_vertex_shader).m_source._M_dataplus._M_p =
       (pointer)&(this->sampling_vertex_shader).m_source.field_2;
  pcVar1 = (param_1->sampling_vertex_shader).m_source._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->sampling_vertex_shader).m_source,pcVar1,
             pcVar1 + (param_1->sampling_vertex_shader).m_source._M_string_length);
  (this->sampling_vertex_shader).m_shader_object_id =
       (param_1->sampling_vertex_shader).m_shader_object_id;
  this->m_sampling_function = param_1->m_sampling_function;
  return;
}

Assistant:

shaderCollectionForSamplingRoutine() : m_sampling_function(Texture)
		{
		}